

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall llm_graph_input_embd::set_input(llm_graph_input_embd *this,llama_ubatch *ubatch)

{
  uint uVar1;
  llama_token *plVar2;
  ggml_tensor *pgVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  
  plVar2 = ubatch->token;
  if (plVar2 != (llama_token *)0x0) {
    uVar1 = ubatch->n_tokens;
    pgVar3 = this->tokens;
    lVar5 = ggml_element_size(pgVar3);
    ggml_backend_tensor_set(pgVar3,plVar2,0,(ulong)uVar1 * lVar5);
  }
  pfVar4 = ubatch->embd;
  if (pfVar4 != (float *)0x0) {
    pgVar3 = this->embd;
    uVar1 = ubatch->n_tokens;
    lVar5 = pgVar3->ne[0];
    lVar6 = ggml_element_size(pgVar3);
    ggml_backend_tensor_set(pgVar3,pfVar4,0,(ulong)uVar1 * lVar5 * lVar6);
    return;
  }
  return;
}

Assistant:

void llm_graph_input_embd::set_input(const llama_ubatch * ubatch) {
    if (ubatch->token) {
        const int64_t n_tokens = ubatch->n_tokens;

        ggml_backend_tensor_set(tokens, ubatch->token, 0, n_tokens*ggml_element_size(tokens));
    }

    if (ubatch->embd) {
        const int64_t n_embd   = embd->ne[0];
        const int64_t n_tokens = ubatch->n_tokens;

        ggml_backend_tensor_set(embd, ubatch->embd, 0, n_tokens*n_embd*ggml_element_size(embd));
    }
}